

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrqfa.cc
# Opt level: O3

base_learner * lrqfa_setup(options_i *options,vw *all)

{
  size_type *__s;
  undefined4 uVar1;
  size_type sVar2;
  pointer pcVar3;
  long *plVar4;
  int iVar5;
  LRQFAstate *pLVar6;
  base_learner *l;
  single_learner *__src;
  learner<LRQFAstate,_example> *__dest;
  size_type sVar7;
  long lVar8;
  string *__range1;
  size_type __dnew_1;
  string lrqfa;
  option_group_definition new_options;
  string lrqopt;
  _func_int ***local_230;
  _func_int **local_228;
  _func_int **local_220 [2];
  long *local_210;
  long local_208;
  long local_200 [2];
  long local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  option_group_definition local_1c8;
  undefined1 local_190 [48];
  string local_160 [64];
  bool local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  string local_f0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_190._0_8_ = (_func_int **)0x16;
  local_230 = local_220;
  local_230 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)local_190);
  local_220[0] = (_func_int **)local_190._0_8_;
  *(undefined4 *)local_230 = 0x20776f4c;
  builtin_strncpy((char *)((long)local_230 + 4),"Rank",4);
  *(undefined4 *)(local_230 + 1) = 0x61755120;
  builtin_strncpy((char *)((long)local_230 + 0xc),"drat",4);
  builtin_strncpy((char *)((long)local_230 + 0xe),"atics FA",8);
  local_228 = (_func_int **)local_190._0_8_;
  *(char *)((long)local_230 + local_190._0_8_) = '\0';
  local_1c8.m_name._M_dataplus._M_p = (pointer)&local_1c8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_230,(pointer)(local_190._0_8_ + (long)local_230));
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  local_f0.field_2._M_allocated_capacity._0_4_ = 0x6671726c;
  local_f0.field_2._M_allocated_capacity._4_2_ = 0x61;
  local_f0._M_string_length = 5;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_190,&local_f0,&local_1e8);
  local_120 = true;
  local_1f0 = 0x38;
  local_210 = local_200;
  local_210 = (long *)std::__cxx11::string::_M_create((ulong *)&local_210,(ulong)&local_1f0);
  local_200[0] = local_1f0;
  local_210[4] = 0x6569662068746977;
  local_210[5] = 0x657261776120646c;
  local_210[2] = 0x6620636974617264;
  local_210[3] = 0x2073657275746165;
  *local_210 = 0x20776f6c20657375;
  local_210[1] = 0x617571206b6e6172;
  local_210[6] = 0x7374686769657720;
  local_208 = local_1f0;
  *(char *)((long)local_210 + local_1f0) = '\0';
  std::__cxx11::string::_M_assign(local_160);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_d0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_190);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_1c8,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cedc0;
  if (local_d0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  local_190._0_8_ = &PTR__typed_option_002cedc0;
  if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
  }
  if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_1c8);
  local_190._16_4_ = 0x6671726c;
  local_190._20_2_ = 0x61;
  local_190._8_8_ = (pointer)0x5;
  local_190._0_8_ = local_190 + 0x10;
  iVar5 = (*options->_vptr_options_i[1])(options);
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_);
  }
  if ((char)iVar5 == '\0') {
    __dest = (learner<LRQFAstate,_example> *)0x0;
  }
  else {
    pLVar6 = calloc_or_throw<LRQFAstate>(1);
    __s = &(pLVar6->field_name)._M_string_length;
    memset(__s,0,0xc20);
    (pLVar6->field_name)._M_dataplus._M_p = (pointer)&(pLVar6->field_name).field_2;
    pLVar6->all = all;
    spoof_hex_encoded_namespaces((string *)local_190,&local_1e8);
    std::__cxx11::string::find_last_not_of(local_190,0x27d0be,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&pLVar6->field_name,(ulong)local_190);
    std::__cxx11::string::substr((ulong)&local_210,(ulong)local_190);
    plVar4 = local_210;
    iVar5 = atoi((char *)local_210);
    pLVar6->k = iVar5;
    if (plVar4 != local_200) {
      operator_delete(plVar4);
    }
    sVar2 = *__s;
    if (sVar2 != 0) {
      pcVar3 = (pLVar6->field_name)._M_dataplus._M_p;
      sVar7 = 0;
      do {
        pLVar6->field_id[pcVar3[sVar7]] = (int)sVar7;
        sVar7 = sVar7 + 1;
      } while (sVar2 != sVar7);
    }
    all->wpp = (pLVar6->k + 1) * all->wpp;
    l = setup_base(options,all);
    __src = LEARNER::as_singleline<char,char>(l);
    sVar2 = (pLVar6->field_name)._M_string_length;
    iVar5 = pLVar6->k;
    uVar1 = *(undefined4 *)(__src + 0xd0);
    __dest = calloc_or_throw<LEARNER::learner<LRQFAstate,example>>(1);
    lVar8 = sVar2 * (long)iVar5 + 1;
    memcpy(__dest,__src,0xe9);
    *(single_learner **)(__dest + 0x20) = __src;
    *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
    *(LRQFAstate **)(__dest + 0xb8) = pLVar6;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = LEARNER::noop;
    *(long *)(__dest + 0xd8) = lVar8;
    *(long *)(__dest + 0xe0) = lVar8 * *(long *)(__src + 0xe0);
    *(LRQFAstate **)(__dest + 0x18) = pLVar6;
    *(code **)(__dest + 0x28) = predict_or_learn<true>;
    *(code **)(__dest + 0x38) = predict_or_learn<true>;
    *(code **)(__dest + 0x30) = predict_or_learn<false>;
    *(undefined8 *)(__dest + 0x40) = 0;
    *(undefined4 *)(__dest + 0xd0) = uVar1;
    __dest[0xe8] = (learner<LRQFAstate,_example>)0x0;
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1c8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_name._M_dataplus._M_p != &local_1c8.m_name.field_2) {
    operator_delete(local_1c8.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  return (base_learner *)__dest;
}

Assistant:

LEARNER::base_learner* lrqfa_setup(options_i& options, vw& all)
{
  std::string lrqfa;
  option_group_definition new_options("Low Rank Quadratics FA");
  new_options.add(make_option("lrqfa", lrqfa).keep().help("use low rank quadratic features with field aware weights"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("lrqfa"))
    return nullptr;

  auto lrq = scoped_calloc_or_throw<LRQFAstate>();
  lrq->all = &all;

  string lrqopt = spoof_hex_encoded_namespaces(lrqfa);
  size_t last_index = lrqopt.find_last_not_of("0123456789");
  new (&lrq->field_name) string(lrqopt.substr(0, last_index + 1));  // make sure there is no duplicates
  lrq->k = atoi(lrqopt.substr(last_index + 1).c_str());

  int fd_id = 0;
  for (char i : lrq->field_name) lrq->field_id[(int)i] = fd_id++;

  all.wpp = all.wpp * (uint64_t)(1 + lrq->k);
  learner<LRQFAstate, example>& l = init_learner(lrq, as_singleline(setup_base(options, all)), predict_or_learn<true>,
      predict_or_learn<false>, 1 + lrq->field_name.size() * lrq->k);

  return make_base(l);
}